

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharTrie.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::RuntimeCharTrie::CloneFrom
          (RuntimeCharTrie *this,ScriptContext *scriptContext,ArenaAllocator *allocator,
          CharTrie *other)

{
  CharTrie *this_00;
  ThreadContext *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_02;
  RuntimeCharTrieEntry *pRVar1;
  int local_64;
  int i;
  TrackAllocData local_50;
  CharTrie *local_28;
  CharTrie *other_local;
  ArenaAllocator *allocator_local;
  ScriptContext *scriptContext_local;
  RuntimeCharTrie *this_local;
  
  local_28 = other;
  other_local = (CharTrie *)allocator;
  allocator_local = (ArenaAllocator *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  this_01 = Js::ScriptContext::GetThreadContext(scriptContext);
  ThreadContext::ProbeStackNoDispose(this_01,0x6000,(ScriptContext *)allocator_local,(PVOID)0x0);
  this_00 = other_local;
  this->count = local_28->count;
  if (this->count < 1) {
    this->children = (RuntimeCharTrieEntry *)0x0;
  }
  else {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&RuntimeCharTrieEntry::typeinfo,0,(long)this->count,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharTrie.cpp"
               ,0xd1);
    this_02 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             this_00,&local_50);
    pRVar1 = Memory::AllocateArray<Memory::ArenaAllocator,UnifiedRegex::RuntimeCharTrieEntry,false>
                       ((Memory *)this_02,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                        (long)this->count);
    this->children = pRVar1;
    for (local_64 = 0; local_64 < this->count; local_64 = local_64 + 1) {
      this->children[local_64].c = local_28->children[local_64].c;
      CloneFrom(&this->children[local_64].node,(ScriptContext *)allocator_local,
                (ArenaAllocator *)other_local,&local_28->children[local_64].node);
    }
  }
  return;
}

Assistant:

void RuntimeCharTrie::CloneFrom(Js::ScriptContext* scriptContext, ArenaAllocator* allocator, const CharTrie& other)
    {
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackRegex);
        count = other.count;
        if (count > 0)
        {
            children = AnewArray(allocator, RuntimeCharTrieEntry, count);
            for (int i = 0; i < count; i++)
            {
                children[i].c = other.children[i].c;
                children[i].node.CloneFrom(scriptContext, allocator,  other.children[i].node);
            }
        }
        else
            children = 0;
    }